

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplashscreen.cpp
# Opt level: O2

bool __thiscall QSplashScreen::event(QSplashScreen *this,QEvent *e)

{
  bool bVar1;
  
  if (*(short *)(e + 8) == 0x11) {
    waitForWidgetMapped(&this->super_QWidget,(int)e);
  }
  else if (*(short *)(e + 8) == 0xc) {
    QSplashScreenPrivate::handlePaintEvent
              (*(QSplashScreenPrivate **)&(this->super_QWidget).field_0x8);
  }
  bVar1 = QWidget::event(&this->super_QWidget,e);
  return bVar1;
}

Assistant:

bool QSplashScreen::event(QEvent *e)
{
    Q_D(QSplashScreen);

    switch (e->type()) {
    case QEvent::Paint:
        d->handlePaintEvent();
        break;
    case QEvent::Show:
        waitForWidgetMapped(this);
        break;
    default:
        break;
    }

    return QWidget::event(e);
}